

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O2

int bit_encode_write_cw(bit_encode_t *be,uint32 codeword,int nbits)

{
  uint uVar1;
  uchar bits [4];
  uint local_c;
  
  uVar1 = codeword << (-(char)nbits & 0x1fU);
  local_c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  bit_encode_write(be,(uchar *)&local_c,nbits);
  return nbits;
}

Assistant:

int
bit_encode_write_cw(bit_encode_t *be, uint32 codeword, int nbits)
{
    unsigned char bits[4];
    codeword <<= (32 - nbits);
    bits[0] = (codeword >> 24) & 0xff;
    bits[1] = (codeword >> 16) & 0xff;
    bits[2] = (codeword >> 8) & 0xff;
    bits[3] = codeword & 0xff;
    return bit_encode_write(be, bits, nbits);
}